

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

string * __thiscall
NDeviceChannel::getPrintStr_abi_cxx11_
          (string *__return_storage_ptr__,NDeviceChannel *this,int indent)

{
  ostream *poVar1;
  int iVar2;
  string indentStr;
  ostringstream oss;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"    ","");
  if (0 < indent) {
    iVar2 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Printing \'NDevice Channel\'\n",0x1b);
  if (0 < indent) {
    iVar2 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -id                  : ",0x1b);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->id)._M_dataplus._M_p,(this->id)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (0 < indent) {
    iVar2 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -startByte           : ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,this->startByte);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (0 < indent) {
    iVar2 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -startBit           : ",0x1a);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,this->startBit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (0 < indent) {
    iVar2 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -type                : ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,this->type);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (0 < indent) {
    iVar2 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -interleavedDataByte : ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,this->interleavedDataByte);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      indent = indent + -1;
    } while (indent != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -interleavedDataBit  : ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,this->interleavedDataBit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string NDeviceChannel::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "Printing 'NDevice Channel'\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -id                  : " << id << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -startByte           : " << startByte << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -startBit           : " << startBit << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -type                : " << type << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -interleavedDataByte : " << interleavedDataByte << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -interleavedDataBit  : " << interleavedDataBit << "\n";
    return(oss.str());
}